

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O1

void __thiscall POSG::SetDiscount(POSG *this,Index agentI,double d)

{
  pointer pdVar1;
  E *this_00;
  
  if ((0.0 <= d) && (d <= 1.0)) {
    pdVar1 = (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)agentI <
        (ulong)((long)(this->_m_discount).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3)) {
      pdVar1[agentI] = d;
      return;
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"POSG::SetDiscount() discount not valid, should be >=0 and <=1");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void POSG::SetDiscount(Index agentI, double d)
{
    if(d>=0 && d<=1)
        _m_discount.at(agentI)=d;
    else
        throw(E("POSG::SetDiscount() discount not valid, should be >=0 and <=1"));
}